

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialSums.h
# Opt level: O1

void __thiscall bwtil::PartialSums::increment(PartialSums *this,symbol s)

{
  byte bVar1;
  byte bVar2;
  pointer puVar3;
  long lVar4;
  uint uVar5;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  undefined7 in_register_00000031;
  ulong uVar6;
  
  uVar10 = CONCAT71(in_register_00000031,s) & 0xffffffff;
  bVar1 = this->d;
  uVar5 = (int)(uVar10 / bVar1) + ((uint)this->nr_of_nodes - (uint)this->nr_of_leafs);
  uVar6 = (ulong)uVar5;
  iVar8 = (int)(uVar10 % (ulong)bVar1);
  if (iVar8 == 0) {
    uVar10 = 0xffffffffffffffff;
  }
  else {
    uVar10 = ~(-1L << ((ulong)((uint)this->log2n * ((uint)bVar1 - iVar8)) & 0x3f));
  }
  puVar3 = (this->nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(this->nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3;
  if (uVar7 <= uVar6) {
LAB_00112aea:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6,
               uVar7);
  }
  puVar3[uVar6] = puVar3[uVar6] + (uVar10 & this->ones);
  if (uVar6 != 0) {
    bVar2 = this->log2n;
    do {
      lVar4 = (long)(int)((uVar5 & 0xffff) - 1) % (long)(int)(bVar1 + 1);
      uVar9 = (uint)lVar4;
      uVar10 = (long)(int)(~uVar9 + (uVar5 & 0xffff)) / (long)(int)(bVar1 + 1);
      uVar6 = uVar10 & 0xffff;
      if (uVar7 <= uVar6) goto LAB_00112aea;
      puVar3[uVar6] =
           puVar3[uVar6] +
           ((-(ulong)((char)lVar4 == '\0') |
            ~(-1L << ((ulong)((bVar1 - uVar9) * (uint)bVar2) & 0x3f))) & this->ones);
      uVar5 = (uint)uVar10;
    } while ((uVar10 & 0xffff) != 0);
  }
  return;
}

Assistant:

void increment(symbol s){

	#ifdef DEBUG
		if(empty){
			cout << "ERROR (PartialSums): increment() called on empty counter\n";
			exit(0);
		}
	#endif

	#ifdef DEBUG
		if(s>=sigma){
			cout << "ERROR (PartialSums): symbol " << s << " not in alphabet.\n";
			exit(0);
		}
	#endif

		uint current_node = (nr_of_nodes - nr_of_leafs) + (s/d);//offset leafs + leaf number
		uint offset_in_node = s%d;//number of the counter inside the node

		incrementFrom(&nodes, current_node, offset_in_node);//increment counters in the leaf

		while(current_node>0){//repeat while current node is not the root

			offset_in_node = childNumber(current_node);
			current_node = parent(current_node);

			incrementFrom(&nodes, current_node, offset_in_node);

		}

	}